

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMElementImpl.cpp
# Opt level: O0

DOMElement * __thiscall
xercesc_4_0::DOMElementImpl::getLastElementChild(DOMElementImpl *this,DOMNode *n)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  DOMNode *local_30;
  DOMNode *next;
  DOMNode *top;
  DOMNode *n_local;
  DOMElementImpl *this_local;
  
  top = n;
  while( true ) {
    if (top == (DOMNode *)0x0) {
      return (DOMElement *)0x0;
    }
    iVar1 = (*top->_vptr_DOMNode[4])();
    if (iVar1 == 1) break;
    iVar1 = (*top->_vptr_DOMNode[8])();
    local_30 = (DOMNode *)CONCAT44(extraout_var,iVar1);
    while ((local_30 == (DOMNode *)0x0 && (n != top))) {
      iVar1 = (*top->_vptr_DOMNode[9])();
      local_30 = (DOMNode *)CONCAT44(extraout_var_00,iVar1);
      if (local_30 == (DOMNode *)0x0) {
        iVar1 = (*top->_vptr_DOMNode[5])();
        top = (DOMNode *)CONCAT44(extraout_var_01,iVar1);
        if ((top == (DOMNode *)0x0) || (n == top)) {
          return (DOMElement *)0x0;
        }
      }
    }
    top = local_30;
  }
  return (DOMElement *)top;
}

Assistant:

DOMElement* DOMElementImpl::getLastElementChild(const DOMNode* n) const
{
    const DOMNode* top = n;
    while (n != NULL) {
        if (n->getNodeType() == DOMNode::ELEMENT_NODE) {
            return (DOMElement*) n;
        }
        DOMNode* next = n->getLastChild();
        while (next == NULL) {
            if (top == n) {
                break;
            }
            next = n->getPreviousSibling();
            if (next == NULL) {
                n = n->getParentNode();
                if (n == NULL || top == n) {
                    return NULL;
                }
            }
        }
        n = next;
    }
    return NULL;
}